

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

int google::protobuf::internal::CalculateReserveSize(int total_size,int new_size)

{
  int *piVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  int local_18;
  int local_14;
  int local_10;
  int new_size_local;
  int total_size_local;
  
  if (new_size < 4) {
    new_size_local = 4;
  }
  else {
    local_14 = new_size;
    local_10 = total_size;
    if (total_size < 0x40000000) {
      local_18 = total_size << 1;
      piVar1 = std::max<int>(&local_18,&local_14);
      new_size_local = *piVar1;
    }
    else {
      local_51 = 0;
      if (new_size < 0x40000001) {
        LogMessage::LogMessage
                  (&local_50,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x382);
        local_51 = 1;
        other = LogMessage::operator<<
                          (&local_50,"CHECK failed: (new_size) > (kRepeatedFieldUpperClampLimit): ")
        ;
        LogFinisher::operator=(local_65,other);
      }
      if ((local_51 & 1) != 0) {
        LogMessage::~LogMessage(&local_50);
      }
      new_size_local = std::numeric_limits<int>::max();
    }
  }
  return new_size_local;
}

Assistant:

inline int CalculateReserveSize(int total_size, int new_size) {
  if (new_size < kRepeatedFieldLowerClampLimit) {
    // Clamp to smallest allowed size.
    return kRepeatedFieldLowerClampLimit;
  }
  if (total_size < kRepeatedFieldUpperClampLimit) {
    return std::max(total_size * 2, new_size);
  } else {
    // Clamp to largest allowed size.
    GOOGLE_DCHECK_GT(new_size, kRepeatedFieldUpperClampLimit);
    return std::numeric_limits<int>::max();
  }
}